

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynet.h
# Opt level: O3

VariableIndex __thiscall
dynet::ComputationGraph::add_function<dynet::MomentBatches,unsigned_int&>
          (ComputationGraph *this,initializer_list<unsigned_int> *arguments,uint *side_information)

{
  uint uVar1;
  iterator __position;
  Node *pNVar2;
  pointer ppNVar3;
  Device **ppDVar4;
  VariableIndex new_node_index;
  allocator_type local_35;
  VariableIndex local_34;
  Node *local_30;
  
  local_34 = (VariableIndex)
             ((ulong)((long)(this->nodes).
                            super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->nodes).
                           super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>._M_impl
                           .super__Vector_impl_data._M_start) >> 3);
  pNVar2 = (Node *)operator_new(0x68);
  uVar1 = *side_information;
  pNVar2->_vptr_Node = (_func_int **)&PTR__Node_005b4008;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&pNVar2->args,*arguments,&local_35);
  (pNVar2->dim).nd = 0;
  (pNVar2->dim).bd = 1;
  pNVar2->device = (Device *)0x0;
  pNVar2->_vptr_Node = (_func_int **)&PTR__Node_005b7758;
  *(uint *)&pNVar2[1]._vptr_Node = uVar1;
  __position._M_current =
       (this->nodes).super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_30 = pNVar2;
  if (__position._M_current ==
      (this->nodes).super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<dynet::Node*,std::allocator<dynet::Node*>>::_M_realloc_insert<dynet::Node*>
              ((vector<dynet::Node*,std::allocator<dynet::Node*>> *)this,__position,&local_30);
    ppNVar3 = (this->nodes).super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    *__position._M_current = pNVar2;
    ppNVar3 = (this->nodes).super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>.
              _M_impl.super__Vector_impl_data._M_finish + 1;
    (this->nodes).super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppNVar3;
  }
  if (ppNVar3[-1]->device == (Device *)0x0) {
    if (arguments->_M_len == 0) {
      ppDVar4 = (Device **)&dynet::default_device;
    }
    else {
      ppDVar4 = &(this->nodes).super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[*arguments->_M_array]->device;
    }
    ppNVar3[-1]->device = *ppDVar4;
  }
  set_dim_for_new_node(this,&local_34);
  return local_34;
}

Assistant:

inline VariableIndex ComputationGraph::add_function(const std::initializer_list<VariableIndex>& arguments,
    Args&&... side_information) {
  VariableIndex new_node_index(nodes.size());
  nodes.push_back(new Function(arguments, std::forward<Args>(side_information)...));
  if (nodes.back()->device == nullptr) {
    if (arguments.size()) {
      nodes.back()->device = nodes[*arguments.begin()]->device;
    } else {
      nodes.back()->device = dynet::default_device;
    }
  }
  set_dim_for_new_node(new_node_index);
  return new_node_index;
}